

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  uint uVar3;
  uint uVar4;
  float *pfVar5;
  float *pfVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  uchar *puVar16;
  float fVar17;
  
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    __ptr = stbi__load_flip(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar3 = *y * *x;
      pfVar2 = (float *)malloc((long)(int)(req_comp * uVar3) << 2);
      if (pfVar2 != (float *)0x0) {
        uVar4 = (req_comp + (req_comp & 1U)) - 1;
        uVar9 = 0;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar7 = uVar9;
        }
        lVar10 = (long)req_comp;
        pfVar6 = pfVar2;
        puVar16 = __ptr;
        uVar11 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar11 = uVar9;
        }
        for (; uVar9 != uVar11; uVar9 = uVar9 + 1) {
          for (uVar14 = 0; uVar7 != uVar14; uVar14 = uVar14 + 1) {
            fVar17 = powf((float)puVar16[uVar14] / 255.0,stbi__l2h_gamma);
            pfVar6[uVar14] = fVar17 * stbi__l2h_scale;
          }
          if ((int)uVar7 < req_comp) {
            lVar8 = uVar9 * lVar10 + uVar7;
            pfVar2[lVar8] = (float)__ptr[lVar8] / 255.0;
          }
          pfVar6 = pfVar6 + lVar10;
          puVar16 = puVar16 + lVar10;
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "outofmem";
    }
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp);
    if (pfVar2 != (float *)0x0) {
      if (stbi__vertically_flip_on_load == 0) {
        return pfVar2;
      }
      uVar3 = *x;
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar4 = *y >> 1;
      uVar7 = 0;
      uVar9 = 0;
      if (0 < req_comp) {
        uVar9 = (ulong)(uint)req_comp;
      }
      lVar10 = (long)req_comp;
      uVar11 = 0;
      if (0 < (int)uVar3) {
        uVar11 = (ulong)uVar3;
      }
      uVar14 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar14 = uVar7;
      }
      iVar1 = (*y + -1) * uVar3;
      pfVar6 = pfVar2;
      for (; uVar7 != uVar14; uVar7 = uVar7 + 1) {
        pfVar5 = (float *)((long)iVar1 * lVar10 * 4 + (long)pfVar2);
        pfVar13 = pfVar6;
        for (uVar15 = 0; uVar15 != uVar11; uVar15 = uVar15 + 1) {
          for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
            fVar17 = pfVar13[uVar12];
            pfVar13[uVar12] = pfVar5[uVar12];
            pfVar5[uVar12] = fVar17;
          }
          pfVar5 = pfVar5 + lVar10;
          pfVar13 = pfVar13 + lVar10;
        }
        iVar1 = iVar1 - uVar3;
        pfVar6 = pfVar6 + lVar10 * (int)uVar3;
      }
      return pfVar2;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}